

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_tensor_layout.cpp
# Opt level: O2

spv_result_t
spvtools::val::anon_unknown_0::ValidateTensorTypeWithDimValuesNV
          (ValidationState_t *_,Instruction *inst,ExpectedNumValues expected,bool is_view)

{
  pointer psVar1;
  pointer psVar2;
  bool bVar3;
  spv_result_t sVar4;
  uint uVar5;
  uint uVar6;
  uint32_t uVar7;
  Instruction *pIVar8;
  char *pcVar9;
  undefined7 in_register_00000009;
  uint64_t dim_value;
  string type_str;
  string local_228;
  DiagnosticStream local_208;
  
  type_str._M_dataplus._M_p = (pointer)&type_str.field_2;
  type_str._M_string_length = 0;
  type_str.field_2._M_local_buf[0] = '\0';
  if ((int)CONCAT71(in_register_00000009,is_view) == 0) {
    sVar4 = ValidateTensorLayoutResultTypeNV(_,inst);
  }
  else {
    sVar4 = ValidateTensorViewResultTypeNV(_,inst);
  }
  if (sVar4 == SPV_SUCCESS) {
    std::__cxx11::string::assign((char *)&type_str);
    uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    uVar6 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    pIVar8 = ValidationState_t::FindDef(_,uVar6);
    if ((pIVar8 == (Instruction *)0x0) || (uVar5 != (pIVar8->inst_).type_id)) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar9 = spvOpcodeString((uint)(inst->inst_).opcode);
      std::operator<<((ostream *)&local_208,pcVar9);
      std::operator<<((ostream *)&local_208," Result Type <id> ");
      ValidationState_t::getIdName_abi_cxx11_(&local_228,_,uVar5);
      std::operator<<((ostream *)&local_208,(string *)&local_228);
      std::operator<<((ostream *)&local_208," does not match ");
      std::operator<<((ostream *)&local_208,(string *)&type_str);
      pcVar9 = " type.";
    }
    else {
      psVar1 = (inst->operands_).
               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      psVar2 = (inst->operands_).
               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pIVar8 = ValidationState_t::FindDef(_,uVar5);
      uVar5 = Instruction::GetOperandAs<unsigned_int>(pIVar8,1);
      bVar3 = ValidationState_t::EvalConstantValUint64(_,uVar5,&dim_value);
      if (bVar3) {
        sVar4 = (*(code *)(&DAT_006c3ee4 + *(int *)(&DAT_006c3ee4 + (ulong)expected * 4)))();
        return sVar4;
      }
      uVar5 = 3;
      do {
        if (((long)psVar1 - (long)psVar2 >> 4) - 3U <= (ulong)(uVar5 - 3)) {
          sVar4 = SPV_SUCCESS;
          goto LAB_0059c2ca;
        }
        uVar6 = Instruction::GetOperandAs<unsigned_int>(inst,(ulong)uVar5);
        pIVar8 = ValidationState_t::FindDef(_,uVar6);
        if ((pIVar8 == (Instruction *)0x0) ||
           (bVar3 = ValidationState_t::IsIntScalarType(_,(pIVar8->inst_).type_id), !bVar3)) break;
        uVar7 = ValidationState_t::GetBitWidth(_,(pIVar8->inst_).type_id);
        uVar5 = uVar5 + 1;
      } while (uVar7 == 0x20);
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar9 = spvOpcodeString((uint)(inst->inst_).opcode);
      std::operator<<((ostream *)&local_208,pcVar9);
      std::operator<<((ostream *)&local_208," operand <id> ");
      ValidationState_t::getIdName_abi_cxx11_(&local_228,_,uVar6);
      std::operator<<((ostream *)&local_208,(string *)&local_228);
      pcVar9 = " is not a 32-bit integer.";
    }
    std::operator<<((ostream *)&local_208,pcVar9);
    std::__cxx11::string::_M_dispose();
    DiagnosticStream::~DiagnosticStream(&local_208);
    sVar4 = local_208.error_;
  }
LAB_0059c2ca:
  std::__cxx11::string::_M_dispose();
  return sVar4;
}

Assistant:

spv_result_t ValidateTensorTypeWithDimValuesNV(ValidationState_t& _,
                                               const Instruction* inst,
                                               ExpectedNumValues expected,
                                               bool is_view) {
  std::string type_str;
  if (is_view) {
    if (auto error = ValidateTensorViewResultTypeNV(_, inst)) return error;
    type_str = "TensorView";
  } else {
    if (auto error = ValidateTensorLayoutResultTypeNV(_, inst)) return error;
    type_str = "TensorLayout";
  }

  const auto result_type_id = inst->GetOperandAs<uint32_t>(0);
  const auto tensor_id = inst->GetOperandAs<uint32_t>(2);
  const auto tensor = _.FindDef(tensor_id);
  if (!tensor || result_type_id != tensor->type_id()) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << spvOpcodeString(inst->opcode()) << " Result Type <id> "
           << _.getIdName(result_type_id) << " does not match " << type_str
           << " type.";
  }

  const auto num_values = inst->operands().size() - 3;

  const auto result_type = _.FindDef(result_type_id);
  const auto dim_index = 1;
  const auto dim_id = result_type->GetOperandAs<uint32_t>(dim_index);
  uint64_t dim_value;
  if (_.EvalConstantValUint64(dim_id, &dim_value)) {
    uint64_t expected_num_values = 0;
    switch (expected) {
      case DIM:
        expected_num_values = dim_value;
        break;
      case DIMx2:
        expected_num_values = dim_value * 2;
        break;
      case ONE:
        expected_num_values = 1;
        break;
      case FOUR:
        expected_num_values = 4;
        break;
    }

    if (num_values != expected_num_values) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << spvOpcodeString(inst->opcode())
             << " unexpected number of operands.";
    }
  }

  for (uint32_t i = 0; i < num_values; ++i) {
    const auto val_id = inst->GetOperandAs<uint32_t>(i + 3);
    const auto val = _.FindDef(val_id);
    if (!val || !_.IsIntScalarType(val->type_id()) ||
        _.GetBitWidth(val->type_id()) != 32) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << spvOpcodeString(inst->opcode()) << " operand <id> "
             << _.getIdName(val_id) << " is not a 32-bit integer.";
    }
  }

  return SPV_SUCCESS;
}